

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O0

int __thiscall
llvm::DWARFExpression::verify
          (DWARFExpression *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen
          )

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  Operation *this_00;
  uchar *sig_00;
  Operation *Op;
  iterator __end1;
  iterator __begin1;
  DWARFExpression *__range1;
  DWARFUnit *U_local;
  DWARFExpression *this_local;
  ulong uVar3;
  
  begin((iterator *)(__end1.Op.OperandEndOffsets + 1),this);
  end((iterator *)&Op,this);
  do {
    bVar1 = llvm::operator!=((iterator *)(__end1.Op.OperandEndOffsets + 1),(iterator *)&Op);
    uVar3 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      this_local._7_1_ = 1;
LAB_02821f09:
      return (int)CONCAT71((int7)(uVar3 >> 8),this_local._7_1_);
    }
    this_00 = iterator::operator*((iterator *)(__end1.Op.OperandEndOffsets + 1));
    uVar2 = Operation::verify(this_00,ctx,sig_00,siglen,tbs,tbslen);
    uVar3 = (ulong)uVar2;
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
      goto LAB_02821f09;
    }
    iterator::operator++((iterator *)(__end1.Op.OperandEndOffsets + 1));
  } while( true );
}

Assistant:

bool DWARFExpression::verify(DWARFUnit *U) {
  for (auto &Op : *this)
    if (!Op.verify(U))
      return false;

  return true;
}